

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

bool benchmark::CpuScalingEnabled(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char (*in_R8) [26];
  int iVar4;
  int cpu;
  char buff [16];
  string governor_file;
  
  cpu = 0;
  iVar1 = NumCPUs();
  iVar2 = 0;
  while (iVar4 = 2, iVar2 < iVar1) {
    StrCat<char_const(&)[28],int&,char_const(&)[26]>
              (&governor_file,(benchmark *)"/sys/devices/system/cpu/cpu",(char (*) [28])&cpu,
               (int *)"/cpufreq/scaling_governor",in_R8);
    __stream = fopen(governor_file._M_dataplus._M_p,"r");
    if (__stream != (FILE *)0x0) {
      sVar3 = fread(buff,1,0x10,__stream);
      fclose(__stream);
      if ((sVar3 < 0xb) || (iVar2 = bcmp(buff,"performance",0xb), iVar2 != 0)) {
        iVar4 = 1;
      }
      else {
        iVar4 = 0;
      }
    }
    std::__cxx11::string::~string((string *)&governor_file);
    if (iVar4 != 0) break;
    iVar2 = cpu + 1;
    cpu = iVar2;
  }
  return iVar4 != 2;
}

Assistant:

bool CpuScalingEnabled() {
#ifndef BENCHMARK_OS_WINDOWS
  // On Linux, the CPUfreq subsystem exposes CPU information as files on the
  // local file system. If reading the exported files fails, then we may not be
  // running on Linux, so we silently ignore all the read errors.
  for (int cpu = 0, num_cpus = NumCPUs(); cpu < num_cpus; ++cpu) {
    std::string governor_file = StrCat("/sys/devices/system/cpu/cpu", cpu,
                                       "/cpufreq/scaling_governor");
    FILE* file = fopen(governor_file.c_str(), "r");
    if (!file) break;
    char buff[16];
    size_t bytes_read = fread(buff, 1, sizeof(buff), file);
    fclose(file);
    if (memprefix(buff, bytes_read, "performance") == nullptr) return true;
  }
#endif
  return false;
}